

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

void __thiscall QLabelPrivate::updateShortcut(QLabelPrivate *this)

{
  QWidget *this_00;
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  QKeySequence local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  this->field_0x340 = this->field_0x340 & 0xdf;
  bVar1 = QString::contains(&this->text,(QChar)0x26,CaseSensitive);
  if (bVar1) {
    this->field_0x340 = this->field_0x340 | 0x20;
    QKeySequence::mnemonic((QString *)local_30);
    iVar2 = QWidget::grabShortcut(this_00,local_30,WindowShortcut);
    this->shortcutId = iVar2;
    QKeySequence::~QKeySequence(local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::updateShortcut()
{
    Q_Q(QLabel);
    Q_ASSERT(shortcutId == 0);
    // Introduce an extra boolean to indicate the presence of a shortcut in the
    // text. We cannot use the shortcutId itself because on the mac mnemonics are
    // off by default, so QKeySequence::mnemonic always returns an empty sequence.
    // But then we do want to hide the ampersands, so we can't use shortcutId.
    hasShortcut = false;

    if (!text.contains(u'&'))
        return;
    hasShortcut = true;
    shortcutId = q->grabShortcut(QKeySequence::mnemonic(text));
}